

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void __thiscall MasterObjectHolder::~MasterObjectHolder(MasterObjectHolder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = ZmqContextManager::setContextToLeakOnDelete(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  if (bVar2) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
    ZmqContextManager::closeContext(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  deleteAll(this);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->errorStrings).m_obj);
  this_00 = (this->tripDetect).lineDetector.
            super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  deque<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>,_std::allocator<std::unique_ptr<helics::AppObject,_std::default_delete<helics::AppObject>_>_>_>
  ::~deque(&(this->apps).m_obj);
  std::
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  ::~deque(&(this->feds).m_obj);
  std::
  deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
  ::~deque(&(this->cores).m_obj);
  std::
  deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
  ::~deque((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
            *)this);
  return;
}

Assistant:

MasterObjectHolder::~MasterObjectHolder()
{
#ifdef HELICS_ENABLE_ZMQ_CORE
    if (ZmqContextManager::setContextToLeakOnDelete()) {
        ZmqContextManager::closeContext();  // LCOV_EXCL_LINE
    }
#endif
    deleteAll();
    // std::cout << "end of master Object Holder destructor" << std::endl;
}